

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O3

bool __thiscall
GlobOpt::OptConstFoldBranch
          (GlobOpt *this,Instr *instr,Value *src1Val,Value *src2Val,Value **pDstVal)

{
  bool bVar1;
  Var src1Var;
  Var src2Var;
  bool local_31 [8];
  bool result;
  
  if (src1Val != (Value *)0x0) {
    src1Var = GetConstantVar(this,instr->m_src1,src1Val);
    if (instr->m_src2 == (Opnd *)0x0) {
      bVar1 = CanProveConditionalBranch(this,instr,src1Val,src2Val,src1Var,(Var)0x0,local_31);
      if (!bVar1) {
        return false;
      }
LAB_00459be3:
      OptConstFoldBr(this,local_31[0],instr,(Value *)0x0,(Value *)0x0);
      return true;
    }
    if (src2Val != (Value *)0x0) {
      src2Var = GetConstantVar(this,instr->m_src2,src2Val);
      bVar1 = CanProveConditionalBranch(this,instr,src1Val,src2Val,src1Var,src2Var,local_31);
      if (bVar1) goto LAB_00459be3;
    }
  }
  return false;
}

Assistant:

bool
GlobOpt::OptConstFoldBranch(IR::Instr *instr, Value *src1Val, Value*src2Val, Value **pDstVal)
{
    if (!src1Val)
    {
        return false;
    }

    Js::Var src1Var = this->GetConstantVar(instr->GetSrc1(), src1Val);

    Js::Var src2Var = nullptr;

    if (instr->GetSrc2())
    {
        if (!src2Val)
        {
            return false;
        }

        src2Var = this->GetConstantVar(instr->GetSrc2(), src2Val);
    }

    bool result;

    if (!CanProveConditionalBranch(instr, src1Val, src2Val, src1Var, src2Var, &result))
    {
        return false;
    }


    this->OptConstFoldBr(!!result, instr);

    return true;
}